

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_render_pass
          (StateRecorder *this,VkRenderPass render_pass,VkRenderPassCreateInfo *create_info,
          Hash custom_hash)

{
  bool bVar1;
  mutex *__mutex;
  VkRenderPassCreateInfo *new_info;
  WorkItem local_50;
  
  __mutex = &this->impl->record_lock;
  std::mutex::lock(__mutex);
  new_info = (VkRenderPassCreateInfo *)0x0;
  bVar1 = Impl::copy_render_pass(this->impl,create_info,&this->impl->temp_allocator,&new_info);
  if (bVar1) {
    local_50.type = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    local_50.create_info = new_info;
    local_50.handle = (uint64_t)render_pass;
    local_50.custom_hash = custom_hash;
    Impl::push_work_locked(this->impl,&local_50);
  }
  else {
    Impl::push_unregister_locked<VkRenderPass_T*>
              (this->impl,VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,render_pass);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar1) {
    Impl::pump_synchronized_recording(this->impl,this);
  }
  return bVar1;
}

Assistant:

bool StateRecorder::record_render_pass(VkRenderPass render_pass, const VkRenderPassCreateInfo &create_info,
                                       Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkRenderPassCreateInfo *new_info = nullptr;
		if (!impl->copy_render_pass(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO, render_pass);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
		                        api_object_cast<uint64_t>(render_pass),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}